

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O2

void duckdb::MatchAndReplace<duckdb::NewLineIdentifier>
               (CSVOption<duckdb::NewLineIdentifier> *original,
               CSVOption<duckdb::NewLineIdentifier> *sniffed,string *name,string *error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (original->set_by_user == true) {
    if (original->value != sniffed->value) {
      ::std::operator+(&local_e0,
                       "CSV Sniffer: Sniffer detected value different than the user input for the ",
                       name);
      ::std::__cxx11::string::append((string *)error);
      ::std::__cxx11::string::~string((string *)&local_e0);
      CSVOption<duckdb::NewLineIdentifier>::FormatValue_abi_cxx11_(&local_40,original);
      ::std::operator+(&local_a0," options \n Set: ",&local_40);
      ::std::operator+(&local_80,&local_a0,", Sniffed: ");
      CSVOption<duckdb::NewLineIdentifier>::FormatValue_abi_cxx11_(&local_c0,sniffed);
      ::std::operator+(&local_60,&local_80,&local_c0);
      ::std::operator+(&local_e0,&local_60,anon_var_dwarf_4b71d2e + 8);
      ::std::__cxx11::string::append((string *)error);
      ::std::__cxx11::string::~string((string *)&local_e0);
      ::std::__cxx11::string::~string((string *)&local_60);
      ::std::__cxx11::string::~string((string *)&local_c0);
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
  }
  else {
    original->value = sniffed->value;
    original->set_by_user = false;
  }
  return;
}

Assistant:

void MatchAndReplace(CSVOption<T> &original, CSVOption<T> &sniffed, const string &name, string &error) {
	if (original.IsSetByUser()) {
		// We verify that the user input matches the sniffed value
		if (original != sniffed) {
			error += "CSV Sniffer: Sniffer detected value different than the user input for the " + name;
			error += " options \n Set: " + original.FormatValue() + ", Sniffed: " + sniffed.FormatValue() + "\n";
		}
	} else {
		// We replace the value of original with the sniffed value
		original.Set(sniffed.GetValue(), false);
	}
}